

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

eSegType ON_LinetypeSegment::SegmentTypeFromUnsigned(uint segment_type_as_unsigned)

{
  eSegType local_c;
  uint segment_type_as_unsigned_local;
  
  if (segment_type_as_unsigned == 0) {
    local_c = Unset;
  }
  else if (segment_type_as_unsigned == 1) {
    local_c = stLine;
  }
  else if (segment_type_as_unsigned == 2) {
    local_c = stSpace;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
               ,0x44,"","Invalid segment_type_as_unsigned value.");
    local_c = stLine;
  }
  return local_c;
}

Assistant:

ON_LinetypeSegment::eSegType ON_LinetypeSegment::SegmentTypeFromUnsigned(
  unsigned int segment_type_as_unsigned
  )
{
  switch (segment_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_LinetypeSegment::eSegType::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_LinetypeSegment::eSegType::stLine);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_LinetypeSegment::eSegType::stSpace);
  }
  ON_ERROR("Invalid segment_type_as_unsigned value.");
  return ON_LinetypeSegment::eSegType::stLine;
}